

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c
# Opt level: O3

filesystem filesystem_create(char *root,filesystem_flags flags)

{
  filesystem __ptr;
  trie ptVar1;
  
  if (root != (char *)0x0) {
    __ptr = (filesystem)malloc(0x18);
    if (__ptr == (filesystem)0x0) {
      log_write_impl_va("metacall",0x28,"filesystem_create",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/filesystem/source/filesystem.c"
                        ,LOG_LEVEL_ERROR,"File system invalid allocation");
      return (filesystem)0x0;
    }
    ptVar1 = trie_create(hash_callback_str,comparable_callback_str);
    __ptr->storage = ptVar1;
    if (ptVar1 != (trie)0x0) {
      __ptr->root = root;
      __ptr->flags = flags;
      return __ptr;
    }
    log_write_impl_va("metacall",0x31,"filesystem_create",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/filesystem/source/filesystem.c"
                      ,LOG_LEVEL_ERROR,"File system invalid storage allocation");
    free(__ptr);
  }
  return (filesystem)0x0;
}

Assistant:

filesystem filesystem_create(const char *root, filesystem_flags flags)
{
	if (root != NULL)
	{
		filesystem fs = malloc(sizeof(struct filesystem_type));

		if (fs == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "File system invalid allocation");

			return NULL;
		}

		fs->storage = trie_create(&hash_callback_str, &comparable_callback_str);

		if (fs->storage == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "File system invalid storage allocation");

			free(fs);

			return NULL;
		}

		fs->root = root;

		fs->flags = flags;

		return fs;
	}

	return NULL;
}